

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit-model-simple.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  void *pvVar5;
  float *pfVar6;
  pointer pLVar7;
  char *pcVar8;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar9;
  const_iterator cVar10;
  int *piVar11;
  long lVar12;
  basic_ostream<char,_std::char_traits<char>_> *pbVar13;
  undefined8 uVar14;
  char *pcVar15;
  Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *lm;
  pointer pLVar16;
  long lVar17;
  __m128 t_2;
  __m128 t_3;
  __m128 t;
  __m128 t_1;
  LandmarkCollection<Eigen::Vector2f> landmarks;
  Vector3f vertex;
  vector<int,_std::allocator<int>_> vertex_indices;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  image_points;
  path outputfile;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  model_points;
  string outputbasename;
  string mappingsfile;
  string landmarksfile;
  string modelfile;
  string imagefile;
  Mat image;
  vector<float,_std::allocator<float>_> fitted_coeffs;
  RenderingParameters rendering_params;
  ScaledOrthoProjectionParameters pose;
  Mat outimg;
  Image4u texturemap;
  Mesh mesh;
  LandmarkMapper landmark_mapper;
  Matrix<float,_3,_4,_0,_3,_4> affine_from_ortho;
  MorphableModel morphable_model;
  ulong in_stack_fffffffffffff5f8;
  vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
  local_9e8;
  undefined1 local_9c8 [32];
  pointer local_9a8;
  vector<int,_std::allocator<int>_> local_968;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_948;
  int local_928;
  int local_924;
  int local_920;
  int local_91c;
  long *local_918;
  undefined8 uStack_910;
  long local_908 [2];
  undefined1 local_8f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8d8;
  long local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  undefined1 local_820 [48];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_7f0 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_7d0 [32];
  options_description *local_7b0;
  _InputArray local_7a8;
  vector<float,_std::allocator<float>_> local_788;
  vector<float,_std::allocator<float>_> local_770;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_758;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_740;
  float *local_728 [2];
  float local_718 [4];
  float local_708 [2];
  float afStack_700 [4];
  _Optional_payload_base<float> _Stack_6f0;
  _Optional_payload_base<float> local_6e8;
  int iStack_6e0;
  int iStack_6dc;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  vector<float,_std::allocator<float>_> local_638;
  VectorXf local_618;
  ScaledOrthoProjectionParameters local_600;
  undefined1 local_5d0 [96];
  Image4u local_570;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_548;
  bool local_528;
  pointer local_520;
  __node_base_ptr local_518;
  _Optional_payload_base<float> local_508;
  int local_500;
  int iStack_4fc;
  pointer local_4f8;
  undefined4 local_4f0;
  undefined4 uStack_4ec;
  pointer local_4e8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_4e0 [8];
  pointer local_4d8;
  pointer local_4d0;
  pointer local_4c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_390;
  Matrix<float,_3,_4,_0,_3,_4> local_358;
  undefined1 local_328 [16];
  undefined1 local_318 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8 [208];
  bool local_1e8;
  bool local_1a8;
  pointer local_1a0;
  pointer paStack_198;
  pointer local_190;
  pointer paStack_188;
  pointer local_180;
  pointer paStack_178;
  Matrix4f local_168;
  Matrix4f local_128;
  Matrix<float,_3,_4,_0,_3,_4> local_e8;
  ScaledOrthoProjectionParameters local_b8;
  float *local_88 [2];
  float local_78;
  float local_68 [2];
  float afStack_60 [4];
  _Optional_payload_base<float> _Stack_50;
  _Optional_payload_base<float> local_48;
  int iStack_40;
  int iStack_3c;
  
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  local_860._M_string_length = 0;
  local_860.field_2._M_local_buf[0] = '\0';
  local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
  local_840._M_string_length = 0;
  local_840.field_2._M_local_buf[0] = '\0';
  local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
  local_880._M_string_length = 0;
  local_880.field_2._M_local_buf[0] = '\0';
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  local_8a0._M_string_length = 0;
  local_8a0.field_2._M_local_buf[0] = '\0';
  local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
  local_8c0._M_string_length = 0;
  local_8c0.field_2._M_local_buf[0] = '\0';
  local_328._0_8_ = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)&local_548,(string *)local_328,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((undefined1 *)local_328._0_8_ != local_318) {
    operator_delete((void *)local_328._0_8_,local_318._0_8_ + 1);
  }
  local_390._M_buckets = (__buckets_ptr)boost::program_options::options_description::add_options();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_390,"help,h");
  ptVar9 = boost::program_options::value<std::__cxx11::string>(&local_860);
  ptVar9->m_required = true;
  local_328._0_8_ = local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,"../share/sfm_shape_3448.bin","");
  ptVar9 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_328);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"model,m",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>(&local_840);
  ptVar9->m_required = true;
  local_820._0_8_ = local_820 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"data/image_0010.png","");
  ptVar9 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_820);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"image,i",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>(&local_880);
  ptVar9->m_required = true;
  local_5d0._0_8_ = local_5d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"data/image_0010.pts","");
  ptVar9 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_5d0);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"landmarks,l",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>(&local_8a0);
  ptVar9->m_required = true;
  local_9c8._0_8_ = local_9c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9c8,"../share/ibug_to_sfm.txt","")
  ;
  ptVar9 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_9c8);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"mapping,p",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>(&local_8c0);
  ptVar9->m_required = true;
  pfVar6 = (float *)((long)&((RenderingParameters *)local_728)->frustum + 0xc);
  local_728[0] = pfVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"out","");
  ptVar9 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_728);
  boost::program_options::options_description_easy_init::operator()
            (pcVar8,(value_semantic *)"output,o",(char *)ptVar9);
  if (local_728[0] != pfVar6) {
    operator_delete(local_728[0],CONCAT44(local_718[1],local_718[0]) + 1);
  }
  if ((undefined1 *)local_9c8._0_8_ != local_9c8 + 0x10) {
    operator_delete((void *)local_9c8._0_8_,local_9c8._16_8_ + 1);
  }
  if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
    operator_delete((void *)local_5d0._0_8_,local_5d0._16_8_ + 1);
  }
  pcVar1 = local_820 + 0x10;
  if ((pointer)local_820._0_8_ != pcVar1) {
    operator_delete((void *)local_820._0_8_,local_820._16_8_ + 1);
  }
  if ((undefined1 *)local_328._0_8_ != local_318) {
    operator_delete((void *)local_328._0_8_,local_318._0_8_ + 1);
  }
  boost::program_options::variables_map::variables_map((variables_map *)local_328);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_820,argc,argv);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_820)
  ;
  local_7b0 = (options_description *)&local_548;
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_5d0,(basic_command_line_parser<char> *)local_820);
  boost::program_options::store((basic_parsed_options *)local_5d0,(variables_map *)local_328,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_5d0);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_7d0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_7f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_820);
  local_820._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"help","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)local_318,(key_type *)local_820);
  if ((pointer)local_820._0_8_ != pcVar1) {
    operator_delete((void *)local_820._0_8_,local_820._16_8_ + 1);
  }
  if (cVar10._M_node == (_Base_ptr)(local_318 + 8)) {
    boost::program_options::notify((variables_map *)local_328);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: fit-model-simple [options]",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    boost::program_options::operator<<((ostream *)&std::cout,(options_description *)&local_548);
  }
  local_328._0_8_ = std::_Hash_bytes;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_2b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_2e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)local_318);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_4e0);
  if (local_508 != (_Optional_payload_base<float>)0x0) {
    operator_delete((void *)local_508,(long)local_4e8 - (long)local_508);
    local_508._M_payload = (_Storage<float,_true>)0x0;
    local_508._M_engaged = false;
    local_508._5_3_ = 0;
    local_500 = 0;
    local_4f8 = (pointer)0x0;
    local_4f0 = 0;
    local_4e8 = (pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector((vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
             *)&local_520);
  if (local_548._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_548._M_value + 0x10)) {
    operator_delete((void *)local_548._M_value._M_dataplus._M_p,(ulong)(local_548._16_8_ + 1));
  }
  if (cVar10._M_node == (_Base_ptr)(local_318 + 8)) {
    cv::imread((string *)local_820,(int)&local_840);
    local_9e8.
    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_9e8.
    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_9e8.
    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_658,local_880._M_dataplus._M_p,
               local_880._M_dataplus._M_p + local_880._M_string_length);
    eos::core::read_pts_landmarks((LandmarkCollection<Eigen::Vector2f> *)&local_548,&local_658);
    local_318._0_8_ =
         local_9e8.
         super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_328._8_8_ =
         local_9e8.
         super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_328._0_8_ =
         local_9e8.
         super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_9e8.
    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_548._M_value._M_dataplus._M_p;
    local_9e8.
    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_548._M_value._M_string_length;
    local_9e8.
    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_548._16_8_;
    local_548._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
    local_548._M_value._M_string_length = 0;
    local_548._16_8_ = (pointer)0x0;
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ::~vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
               *)local_328);
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ::~vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
               *)&local_548);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658._M_dataplus._M_p != &local_658.field_2) {
      operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
    }
    local_1e8 = false;
    local_1a8 = false;
    memset(local_328,0,0xd0);
    local_1a0 = (pointer)0x0;
    paStack_198 = (pointer)0x0;
    local_190 = (pointer)0x0;
    paStack_188 = (pointer)0x0;
    local_180 = (pointer)0x0;
    paStack_178 = (pointer)0x0;
    local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_678,local_860._M_dataplus._M_p,
               local_860._M_dataplus._M_p + local_860._M_string_length);
    eos::morphablemodel::load_model((MorphableModel *)&local_548,&local_678);
    eos::morphablemodel::MorphableModel::operator=
              ((MorphableModel *)local_328,(MorphableModel *)&local_548);
    eos::morphablemodel::MorphableModel::~MorphableModel((MorphableModel *)&local_548);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p != &local_678.field_2) {
      operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
    }
    local_390._M_buckets = &local_390._M_single_bucket;
    local_390._M_bucket_count = 1;
    local_390._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_390._M_element_count = 0;
    local_390._M_rehash_policy._M_max_load_factor = 1.0;
    local_390._M_rehash_policy._M_next_resize = 0;
    local_390._M_single_bucket = (__node_base_ptr)0x0;
    local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_698,local_8a0._M_dataplus._M_p,
               local_8a0._M_dataplus._M_p + local_8a0._M_string_length);
    eos::core::LandmarkMapper::LandmarkMapper((LandmarkMapper *)&local_548,&local_698);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&local_390,&local_548);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_548);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p != &local_698.field_2) {
      operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
    }
    cv::Mat::clone();
    pLVar7 = local_9e8.
             super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_9e8.
        super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_9e8.
        super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pLVar16 = local_9e8.
                super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_9c8._16_8_ = (void *)0x0;
        local_9c8._0_4_ = 0x3010000;
        local_9c8._8_8_ = local_5d0;
        fVar2 = (pLVar16->coordinates).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                m_storage.m_data.array[0];
        fVar3 = (pLVar16->coordinates).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                m_storage.m_data.array[1];
        local_920 = (int)ROUND(fVar2 + -2.0);
        local_91c = (int)ROUND(fVar3 + -2.0);
        local_928 = (int)ROUND(fVar2 + 2.0);
        local_924 = (int)ROUND(fVar3 + 2.0);
        local_548._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x406fe00000000000;
        local_548._M_value._M_string_length = 0;
        local_548._16_8_ = (pointer)0x0;
        local_548._24_8_ = (void *)0x0;
        in_stack_fffffffffffff5f8 = in_stack_fffffffffffff5f8 & 0xffffffff00000000;
        cv::rectangle(local_9c8,&local_920,&local_928,&local_548,1,8,in_stack_fffffffffffff5f8);
        pLVar16 = pLVar16 + 1;
      } while (pLVar16 != pLVar7);
    }
    local_8d8._M_allocated_capacity = 0;
    local_8d8._8_8_ = 0;
    local_8c8 = 0;
    local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_948.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_948.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_948.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_9e8.
        super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_9e8.
        super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar17 = 0x20;
      pcVar8 = (char *)0x0;
      do {
        lVar12 = *(long *)((long)(&(local_9e8.
                                    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->coordinates + -8) +
                          lVar17);
        local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6b8,lVar12,
                   *(long *)((long)(&(local_9e8.
                                      super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->coordinates + -7)
                            + lVar17) + lVar12);
        eos::core::LandmarkMapper::convert
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_548,(LandmarkMapper *)&local_390,&local_6b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
          operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
        }
        uVar14 = local_548._M_value._M_dataplus._M_p;
        if (local_528 != false) {
          piVar11 = __errno_location();
          iVar4 = *piVar11;
          *piVar11 = 0;
          lVar12 = strtol((char *)uVar14,(char **)local_9c8,10);
          if (local_9c8._0_8_ == uVar14) {
            std::__throw_invalid_argument("stoi");
LAB_00109b10:
            uVar14 = std::__throw_out_of_range("stoi");
            if ((char *)local_9c8._0_8_ != pcVar8) {
              operator_delete((void *)local_9c8._0_8_,local_9c8._16_8_ + 1);
            }
            if ((Size *)CONCAT44(local_7a8._4_4_,local_7a8.flags) != &local_7a8.sz) {
              operator_delete((undefined1 *)CONCAT44(local_7a8._4_4_,local_7a8.flags),
                              (long)local_7a8.sz + 1);
            }
            if (local_918 != local_908) {
              operator_delete(local_918,local_908[0] + 1);
            }
            if ((string *)local_8f8._0_8_ != &local_6b8) {
              operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
            }
            if (local_570.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_570.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_570.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_570.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            eos::core::Mesh::~Mesh((Mesh *)&local_548);
            if (local_770.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_770.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_770.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_770.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_948.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_948.
                              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_948.
                                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_948.
                                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((pointer)local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if ((void *)local_8d8._M_allocated_capacity != (void *)0x0) {
              operator_delete((void *)local_8d8._M_allocated_capacity,local_8c8 - local_8d8._0_8_);
            }
            cv::Mat::~Mat((Mat *)local_5d0);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_390);
            eos::morphablemodel::MorphableModel::~MorphableModel((MorphableModel *)local_328);
            std::
            vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
            ::~vector(&local_9e8);
            cv::Mat::~Mat((Mat *)local_820);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
              operator_delete(local_8c0._M_dataplus._M_p,
                              CONCAT71(local_8c0.field_2._M_allocated_capacity._1_7_,
                                       local_8c0.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
              operator_delete(local_8a0._M_dataplus._M_p,
                              CONCAT71(local_8a0.field_2._M_allocated_capacity._1_7_,
                                       local_8a0.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_880._M_dataplus._M_p != &local_880.field_2) {
              operator_delete(local_880._M_dataplus._M_p,
                              CONCAT71(local_880.field_2._M_allocated_capacity._1_7_,
                                       local_880.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_840._M_dataplus._M_p != &local_840.field_2) {
              operator_delete(local_840._M_dataplus._M_p,
                              CONCAT71(local_840.field_2._M_allocated_capacity._1_7_,
                                       local_840.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_860._M_dataplus._M_p != &local_860.field_2) {
              operator_delete(local_860._M_dataplus._M_p,
                              CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                       local_860.field_2._M_local_buf[0]) + 1);
            }
            _Unwind_Resume(uVar14);
          }
          if (((int)(float)lVar12 != lVar12) || (*piVar11 == 0x22)) goto LAB_00109b10;
          if (*piVar11 == 0) {
            *piVar11 = iVar4;
          }
          local_600.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = (float)lVar12;
          eos::morphablemodel::PcaModel::get_mean_at_point((PcaModel *)local_9c8,(int)local_328);
          local_728[0] = (float *)local_9c8;
          std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
          ::emplace_back<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>>
                    ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                      *)local_8d8._M_local_buf,
                     (Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> *)local_728);
          if (local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_968,
                       (iterator)
                       local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_600);
          }
          else {
            *local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = (int)local_600.R.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data.array[0];
            local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
          ::emplace_back<Eigen::Matrix<float,2,1,0,2,1>&>
                    ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                      *)&local_948,
                     (Matrix<float,_2,_1,_0,_2,_1> *)
                     ((long)&(((Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)
                              (&(local_9e8.
                                 super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->coordinates + -4))->
                             name)._M_dataplus._M_p + lVar17));
        }
        if (local_528 == true) {
          local_528 = false;
          if (local_548._M_value._M_dataplus._M_p !=
              (_Alloc_hider)((long)&local_548._M_value + 0x10)) {
            operator_delete((void *)local_548._M_value._M_dataplus._M_p,
                            (ulong)(local_548._16_8_ + 1));
          }
        }
        pcVar8 = pcVar8 + 1;
        pcVar15 = (char *)(((long)local_9e8.
                                  super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_9e8.
                                  super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x3333333333333333);
        lVar17 = lVar17 + 0x28;
      } while (pcVar8 <= pcVar15 && (long)pcVar15 - (long)pcVar8 != 0);
    }
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::vector(&local_740,&local_948);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::vector(&local_758,
             (vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              *)&local_8d8);
    pcVar8 = local_9c8 + 0x10;
    eos::fitting::estimate_orthographic_projection_linear
              (&local_600,&local_740,&local_758,true,
               (optional<int>)((ulong)(uint)local_820._8_4_ | 0x100000000));
    if (local_758.
        super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_758.
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_758.
                            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_758.
                            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_740.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_740.
                      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_740.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_740.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = local_600.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = local_600.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = local_600.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = local_600.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = local_600.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = local_600.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = local_600.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = local_600.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = local_600.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8];
    local_b8.tx = local_600.tx;
    local_b8.ty = local_600.ty;
    local_b8.s = local_600.s;
    eos::fitting::RenderingParameters::RenderingParameters
              ((RenderingParameters *)local_728,&local_b8,local_820._12_4_,local_820._8_4_);
    eos::fitting::RenderingParameters::get_yaw_pitch_roll((RenderingParameters *)&local_548);
    local_88[0] = local_728[0];
    local_88[1] = local_728[1];
    local_78 = local_718[0];
    local_68[0] = local_708[0];
    local_68[1] = local_708[1];
    afStack_60[0] = afStack_700[0];
    afStack_60[1] = afStack_700[1];
    afStack_60[2] = afStack_700[2];
    afStack_60[3] = afStack_700[3];
    _Stack_50 = _Stack_6f0;
    local_48 = local_6e8;
    iStack_40 = iStack_6e0;
    iStack_3c = iStack_6dc;
    eos::fitting::get_3x4_affine_camera_matrix
              (&local_358,(RenderingParameters *)local_88,local_820._12_4_,local_820._8_4_);
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0] =
         local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[0];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1] =
         local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[1];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
         local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[2];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3] =
         local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[3];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4] =
         local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[4];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[5] =
         local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[5];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[6] =
         local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[6];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[7] =
         local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[7];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[8] =
         local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[8];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[9] =
         local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[9];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[10]
         = local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[10];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0xb]
         = local_358.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0xb];
    local_618.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (float *)0x0;
    local_618.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    eos::fitting::fit_shape_to_landmarks_linear
              (&local_770,(PcaModel *)local_328,&local_e8,&local_948,&local_968,&local_618,3.0,
               (optional<int>)0x0,(optional<float>)0x0,(optional<float>)0x0);
    free(local_618.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    std::vector<float,_std::allocator<float>_>::vector(&local_788,&local_770);
    local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    eos::morphablemodel::MorphableModel::draw_sample
              ((Mesh *)&local_548,(MorphableModel *)local_328,&local_788,&local_638);
    if (local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_638.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_788.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_788.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_788.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_788.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    eos::fitting::RenderingParameters::get_modelview(&local_128,(RenderingParameters *)local_728);
    eos::fitting::RenderingParameters::get_projection(&local_168,(RenderingParameters *)local_728);
    eos::core::from_mat_with_alpha((Image4u *)local_9c8,(Mat *)local_820);
    eos::render::extract_texture
              (&local_570,(Mesh *)&local_548,&local_128,&local_168,Orthographic,(Image4u *)local_9c8
               ,0x200);
    if ((void *)local_9c8._16_8_ != (void *)0x0) {
      operator_delete((void *)local_9c8._16_8_,(long)local_9a8 - local_9c8._16_8_);
    }
    local_9c8._0_8_ = pcVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_9c8,local_8c0._M_dataplus._M_p,
               local_8c0._M_dataplus._M_p + local_8c0._M_string_length);
    std::__cxx11::string::append(local_9c8);
    local_8f8._0_8_ = (string *)(local_8f8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_8f8,local_9c8._0_8_,(undefined1 *)(local_9c8._8_8_ + local_9c8._0_8_)
              );
    if ((char *)local_9c8._0_8_ != pcVar8) {
      operator_delete((void *)local_9c8._0_8_,local_9c8._16_8_ + 1);
    }
    local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6d8,local_8f8._0_8_,(pointer)(local_8f8._0_8_ + local_8f8._8_8_));
    eos::core::write_textured_obj((Mesh *)&local_548,&local_6d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
      operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
    }
    local_9c8._0_8_ = pcVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9c8,".texture.png","");
    boost::filesystem::path::replace_extension((path *)local_8f8);
    if ((char *)local_9c8._0_8_ != pcVar8) {
      operator_delete((void *)local_9c8._0_8_,local_9c8._16_8_ + 1);
    }
    eos::core::to_mat((core *)local_9c8,&local_570);
    local_7a8.sz.width = 0;
    local_7a8.sz.height = 0;
    local_7a8.flags = 0x1010000;
    local_908[0] = 0;
    local_918 = (long *)0x0;
    uStack_910 = 0;
    local_7a8.obj = (core *)local_9c8;
    cv::imwrite((string *)local_8f8,&local_7a8,(vector *)&local_918);
    if (local_918 != (long *)0x0) {
      operator_delete(local_918,local_908[0] - (long)local_918);
    }
    cv::Mat::~Mat((Mat *)local_9c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Finished fitting and wrote result mesh and texture to files with basename ",0x4a);
    boost::filesystem::path::stem();
    boost::filesystem::path::stem();
    local_9c8._0_8_ = pcVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_9c8,CONCAT44(local_7a8._4_4_,local_7a8.flags),
               (core *)((long)local_7a8.obj + CONCAT44(local_7a8._4_4_,local_7a8.flags)));
    pbVar13 = boost::io::detail::quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                        ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_9c8,'&','\"');
    if ((char *)local_9c8._0_8_ != pcVar8) {
      operator_delete((void *)local_9c8._0_8_,local_9c8._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(pbVar13,".",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar13 + -0x18) + (char)pbVar13);
    std::ostream::put((char)pbVar13);
    std::ostream::flush();
    if ((Size *)CONCAT44(local_7a8._4_4_,local_7a8.flags) != &local_7a8.sz) {
      operator_delete((undefined1 *)CONCAT44(local_7a8._4_4_,local_7a8.flags),(long)local_7a8.sz + 1
                     );
    }
    if (local_918 != local_908) {
      operator_delete(local_918,local_908[0] + 1);
    }
    if ((string *)local_8f8._0_8_ != (string *)(local_8f8 + 0x10)) {
      operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
    }
    if (local_570.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_570.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_570.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4d0 != (pointer)0x0) {
      operator_delete(local_4d0,(long)local_4c0 - (long)local_4d0);
    }
    if (local_4e8 != (pointer)0x0) {
      operator_delete(local_4e8,(long)local_4d8 - (long)local_4e8);
    }
    pvVar5 = (void *)CONCAT44(iStack_4fc,local_500);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,CONCAT44(uStack_4ec,local_4f0) - (long)pvVar5);
    }
    if (local_518 != (__node_base_ptr)0x0) {
      operator_delete(local_518,(long)local_508 - (long)local_518);
    }
    if ((void *)local_548._24_8_ != (void *)0x0) {
      operator_delete((void *)local_548._24_8_,(long)local_520 - local_548._24_8_);
    }
    if (local_548._M_value._M_dataplus._M_p != (pointer)0x0) {
      operator_delete((void *)local_548._M_value._M_dataplus._M_p,local_548._16_8_ - local_548._0_8_
                     );
    }
    if (local_770.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_770.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_770.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_770.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_948.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_948.
                      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_948.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_948.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_968.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((void *)local_8d8._M_allocated_capacity != (void *)0x0) {
      operator_delete((void *)local_8d8._M_allocated_capacity,local_8c8 - local_8d8._0_8_);
    }
    cv::Mat::~Mat((Mat *)local_5d0);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_390);
    eos::morphablemodel::MorphableModel::~MorphableModel((MorphableModel *)local_328);
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ::~vector(&local_9e8);
    cv::Mat::~Mat((Mat *)local_820);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
    operator_delete(local_8c0._M_dataplus._M_p,
                    CONCAT71(local_8c0.field_2._M_allocated_capacity._1_7_,
                             local_8c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p,
                    CONCAT71(local_8a0.field_2._M_allocated_capacity._1_7_,
                             local_8a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880._M_dataplus._M_p != &local_880.field_2) {
    operator_delete(local_880._M_dataplus._M_p,
                    CONCAT71(local_880.field_2._M_allocated_capacity._1_7_,
                             local_880.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p,
                    CONCAT71(local_840.field_2._M_allocated_capacity._1_7_,
                             local_840.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,
                    CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                             local_860.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    string modelfile, imagefile, landmarksfile, mappingsfile, outputbasename;
    try
    {
        po::options_description desc("Allowed options");
        // clang-format off
        desc.add_options()
            ("help,h", "display the help message")
            ("model,m", po::value<string>(&modelfile)->required()->default_value("../share/sfm_shape_3448.bin"),
                "a Morphable Model stored as cereal BinaryArchive")
            ("image,i", po::value<string>(&imagefile)->required()->default_value("data/image_0010.png"),
                "an input image")
            ("landmarks,l", po::value<string>(&landmarksfile)->required()->default_value("data/image_0010.pts"),
                "2D landmarks for the image, in ibug .pts format")
            ("mapping,p", po::value<string>(&mappingsfile)->required()->default_value("../share/ibug_to_sfm.txt"),
                "landmark identifier to model vertex number mapping")
            ("output,o", po::value<string>(&outputbasename)->required()->default_value("out"),
                "basename for the output rendering and obj files");
        // clang-format on
        po::variables_map vm;
        po::store(po::command_line_parser(argc, argv).options(desc).run(), vm);
        if (vm.count("help"))
        {
            cout << "Usage: fit-model-simple [options]" << endl;
            cout << desc;
            return EXIT_SUCCESS;
        }
        po::notify(vm);
    } catch (const po::error& e)
    {
        cout << "Error while parsing command-line arguments: " << e.what() << endl;
        cout << "Use --help to display a list of options." << endl;
        return EXIT_FAILURE;
    }

    // Load the image, landmarks, LandmarkMapper and the Morphable Model:
    Mat image = cv::imread(imagefile);
    LandmarkCollection<Eigen::Vector2f> landmarks;
    try
    {
        landmarks = core::read_pts_landmarks(landmarksfile);
    } catch (const std::runtime_error& e)
    {
        cout << "Error reading the landmarks: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    morphablemodel::MorphableModel morphable_model;
    try
    {
        morphable_model = morphablemodel::load_model(modelfile);
    } catch (const std::runtime_error& e)
    {
        cout << "Error loading the Morphable Model: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    // The landmark mapper is used to map 2D landmark points (e.g. from the ibug scheme) to vertex ids:
    core::LandmarkMapper landmark_mapper;
    try
    {
        landmark_mapper = core::LandmarkMapper(mappingsfile);
    } catch (const std::exception& e)
    {
        cout << "Error loading the landmark mappings: " << e.what() << endl;
        return EXIT_FAILURE;
    }

    // Draw the loaded landmarks:
    Mat outimg = image.clone();
    for (auto&& lm : landmarks)
    {
        cv::rectangle(outimg, cv::Point2f(lm.coordinates[0] - 2.0f, lm.coordinates[1] - 2.0f),
                      cv::Point2f(lm.coordinates[0] + 2.0f, lm.coordinates[1] + 2.0f), {255, 0, 0});
    }

    // These will be the final 2D and 3D points used for the fitting:
    vector<Vector4f> model_points; // the points in the 3D shape model
    vector<int> vertex_indices;    // their vertex indices
    vector<Vector2f> image_points; // the corresponding 2D landmark points

    // Sub-select all the landmarks which we have a mapping for (i.e. that are defined in the 3DMM):
    for (int i = 0; i < landmarks.size(); ++i)
    {
        const auto converted_name = landmark_mapper.convert(landmarks[i].name);
        if (!converted_name)
        { // no mapping defined for the current landmark
            continue;
        }
        const int vertex_idx = std::stoi(converted_name.value());
        const auto vertex = morphable_model.get_shape_model().get_mean_at_point(vertex_idx);
        model_points.emplace_back(vertex.homogeneous());
        vertex_indices.emplace_back(vertex_idx);
        image_points.emplace_back(landmarks[i].coordinates);
    }

    // Estimate the camera (pose) from the 2D - 3D point correspondences
    fitting::ScaledOrthoProjectionParameters pose =
        fitting::estimate_orthographic_projection_linear(image_points, model_points, true, image.rows);
    fitting::RenderingParameters rendering_params(pose, image.cols, image.rows);

    // The 3D head pose can be recovered as follows - the function returns an Eigen::Vector3f with yaw, pitch,
    // and roll angles:
    const float yaw_angle = rendering_params.get_yaw_pitch_roll()[0];

    // Estimate the shape coefficients by fitting the shape to the landmarks:
    const Eigen::Matrix<float, 3, 4> affine_from_ortho =
        fitting::get_3x4_affine_camera_matrix(rendering_params, image.cols, image.rows);
    const vector<float> fitted_coeffs = fitting::fit_shape_to_landmarks_linear(
        morphable_model.get_shape_model(), affine_from_ortho, image_points, vertex_indices);

    // Obtain the full mesh with the estimated coefficients:
    const core::Mesh mesh = morphable_model.draw_sample(fitted_coeffs, vector<float>());

    // Extract the texture from the image using given mesh and camera parameters:
    const core::Image4u texturemap =
        render::extract_texture(mesh, rendering_params.get_modelview(), rendering_params.get_projection(),
                                render::ProjectionType::Orthographic, core::from_mat_with_alpha(image));

    // Save the mesh as textured obj:
    fs::path outputfile = outputbasename + ".obj";
    core::write_textured_obj(mesh, outputfile.string());

    // And save the texture map:
    outputfile.replace_extension(".texture.png");
    cv::imwrite(outputfile.string(), core::to_mat(texturemap));

    cout << "Finished fitting and wrote result mesh and texture to files with basename "
         << outputfile.stem().stem() << "." << endl;

    return EXIT_SUCCESS;
}